

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::B3DImporter::Fail(B3DImporter *this,string *str)

{
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_38,"B3D Importer - error in B3D file data: ",str);
  std::runtime_error::runtime_error(this_00,(string *)&bStack_38);
  *(undefined ***)this_00 = &PTR__runtime_error_0080bf48;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void B3DImporter::Fail( string str ){
#ifdef DEBUG_B3D
    ASSIMP_LOG_ERROR_F("Error in B3D file data: ", str);
#endif
    throw DeadlyImportError( "B3D Importer - error in B3D file data: "+str );
}